

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcArithmeticCodec.h
# Opt level: O0

void o3dgc::EncodeUIntACEGC
               (long predResidual,Arithmetic_Codec *ace,Adaptive_Data_Model *mModelValues,
               Static_Bit_Model *bModel0,Adaptive_Bit_Model *bModel1,unsigned_long M)

{
  unsigned_long uiValue;
  unsigned_long M_local;
  Adaptive_Bit_Model *bModel1_local;
  Static_Bit_Model *bModel0_local;
  Adaptive_Data_Model *mModelValues_local;
  Arithmetic_Codec *ace_local;
  long predResidual_local;
  
  if ((ulong)predResidual < M) {
    Arithmetic_Codec::encode(ace,(uint)predResidual,mModelValues);
  }
  else {
    Arithmetic_Codec::encode(ace,(uint)M,mModelValues);
    Arithmetic_Codec::ExpGolombEncode(ace,(uint)predResidual - (uint)M,0,bModel0,bModel1);
  }
  return;
}

Assistant:

inline void EncodeUIntACEGC(long predResidual, 
                                Arithmetic_Codec & ace,
                                Adaptive_Data_Model & mModelValues,
                                Static_Bit_Model & bModel0,
                                Adaptive_Bit_Model & bModel1,
                                const unsigned long M)
    {
        unsigned long uiValue = (unsigned long) predResidual;
        if (uiValue < M) 
        {
            ace.encode(uiValue, mModelValues);
        }
        else 
        {
            ace.encode(M, mModelValues);
            ace.ExpGolombEncode(uiValue-M, 0, bModel0, bModel1);
        }
    }